

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_valueAssignmentForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
~optTyped_valueAssignmentForNotEmpty_Test
          (optTyped_valueAssignmentForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TYPED_TEST(optTyped, valueAssignmentForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o{this->value_2};
  o = this->value_1;
  EXPECT_TRUE(o);
  EXPECT_TRUE(o.has_value());
  EXPECT_EQ(this->value_1, *o);
  EXPECT_EQ(this->value_1, o.value());
  EXPECT_EQ(this->value_1, o.value_or(this->value_2));
}